

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_column_blob(sqlite3_stmt *pStmt,int i)

{
  Mem *pVal;
  void *pvVar1;
  
  pVal = columnMem(pStmt,i);
  pvVar1 = sqlite3_value_blob(pVal);
  columnMallocFailure(pStmt);
  return pvVar1;
}

Assistant:

SQLITE_API const void *sqlite3_column_blob(sqlite3_stmt *pStmt, int i){
  const void *val;
  val = sqlite3_value_blob( columnMem(pStmt,i) );
  /* Even though there is no encoding conversion, value_blob() might
  ** need to call malloc() to expand the result of a zeroblob()
  ** expression.
  */
  columnMallocFailure(pStmt);
  return val;
}